

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

char * m_tmpnam(void)

{
  char *pcVar1;
  char *__src;
  char cwd [4097];
  char acStack_1028 [4112];
  
  m_tmpnam::name[0] = '\0';
  pcVar1 = getenv("TMPDIR");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("TMP");
  }
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("TEMP");
  }
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("TEMPDIR");
  }
  __src = "";
  if (pcVar1 != (char *)0x0) {
    __src = pcVar1;
  }
  strcpy(m_tmpnam::name,__src);
  getcwd(acStack_1028,0x1000);
  chdir(__src);
  pcVar1 = tmpnam((char *)0x0);
  strcat(m_tmpnam::name,pcVar1);
  chdir(acStack_1028);
  return m_tmpnam::name;
}

Assistant:

char* m_tmpnam()
{
    static char name[PATH_MAX * 2 + 1];
#if !defined(__APPLE__)
    char cwd[PATH_MAX + 1];
#endif
    name[0] = 0;
#ifdef _WIN32
    GetTempPath(PATH_MAX, name);
    GetCurrentDirectory(PATH_MAX, cwd);
    SetCurrentDirectory(name);
    strcat(name, tmpnam(NULL));
    SetCurrentDirectory(cwd);
#elif defined(__APPLE__)
    strcpy(name, tmpnam(NULL));
#else
    char* tmp_path = NULL;
    tmp_path = getenv("TMPDIR");
    if (!tmp_path)
        tmp_path = getenv("TMP");
    if (!tmp_path)
        tmp_path = getenv("TEMP");
    if (!tmp_path)
        tmp_path = getenv("TEMPDIR");
    if (!tmp_path)
        tmp_path = "";

    strcpy(name, tmp_path);
    getcwd(cwd, PATH_MAX);
    chdir(tmp_path);
    strcat(name, tmpnam(NULL));
    chdir(cwd);
#endif
    return name;
}